

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error epilogProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  undefined4 uVar1;
  int iVar2;
  char *pcStack_38;
  int tok;
  char *next;
  char **nextPtr_local;
  char *end_local;
  char *s_local;
  XML_Parser parser_local;
  
  *(code **)((long)parser + 0x208) = epilogProcessor;
  *(char **)((long)parser + 0x218) = s;
  next = (char *)nextPtr;
  nextPtr_local = (char **)end;
  end_local = s;
  s_local = (char *)parser;
  do {
    uVar1 = (*(code *)**(undefined8 **)(s_local + 0x118))
                      (*(undefined8 **)(s_local + 0x118),end_local,nextPtr_local,
                       &stack0xffffffffffffffc8);
    *(char **)(s_local + 0x220) = pcStack_38;
    switch(uVar1) {
    case 0:
      *(char **)(s_local + 0x218) = pcStack_38;
      return XML_ERROR_INVALID_TOKEN;
    case 0xb:
      iVar2 = reportProcessingInstruction
                        (s_local,*(ENCODING **)(s_local + 0x118),end_local,pcStack_38);
      if (iVar2 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 0xd:
      iVar2 = reportComment(s_local,*(ENCODING **)(s_local + 0x118),end_local,pcStack_38);
      if (iVar2 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 0xf:
      if (*(long *)(s_local + 0xa0) != 0) {
        reportDefault(s_local,*(ENCODING **)(s_local + 0x118),end_local,pcStack_38);
      }
      break;
    case 0xfffffff1:
      if (*(long *)(s_local + 0xa0) != 0) {
        *(char ***)(s_local + 0x220) = nextPtr_local;
        reportDefault(s_local,*(ENCODING **)(s_local + 0x118),end_local,(char *)nextPtr_local);
      }
    case 0xfffffffc:
      if (next != (char *)0x0) {
        *(char ***)next = nextPtr_local;
      }
      return XML_ERROR_NONE;
    default:
      return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
    case 0xfffffffe:
      if (next != (char *)0x0) {
        *(char **)next = end_local;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case 0xffffffff:
      if (next != (char *)0x0) {
        *(char **)next = end_local;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    }
    end_local = pcStack_38;
    *(char **)(s_local + 0x218) = pcStack_38;
  } while( true );
}

Assistant:

static
enum XML_Error epilogProcessor(XML_Parser parser,
                               const char *s,
                               const char *end,
                               const char **nextPtr)
{
  processor = epilogProcessor;
  eventPtr = s;
  for (;;) {
    const char *next;
    int tok = XmlPrologTok(encoding, s, end, &next);
    eventEndPtr = next;
    switch (tok) {
    case -XML_TOK_PROLOG_S:
      if (defaultHandler) {
        eventEndPtr = end;
        reportDefault(parser, encoding, s, end);
      }
      /* fall through */
    case XML_TOK_NONE:
      if (nextPtr)
        *nextPtr = end;
      return XML_ERROR_NONE;
    case XML_TOK_PROLOG_S:
      if (defaultHandler)
        reportDefault(parser, encoding, s, next);
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_INVALID:
      eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    default:
      return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
    }
    eventPtr = s = next;
  }
}